

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O3

void Abc_NtkFlattenHierarchyGia2_rec(Gia_Man_t *pNew,Abc_Ntk_t *pNtk,int *pCounter,Vec_Int_t *vBufs)

{
  void *pvVar1;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk_00;
  long *plVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  
  pvVar1 = pNtk->pData;
  *pCounter = *pCounter + 1;
  if (0 < *(int *)((long)pvVar1 + 4)) {
    lVar8 = 0;
    do {
      pNode = *(Abc_Obj_t **)(*(long *)((long)pvVar1 + 8) + lVar8 * 8);
      uVar4 = *(uint *)&pNode->field_0x14 & 0xf;
      if (uVar4 == 7) {
        iVar5 = Abc_NodeStrashToGia(pNew,pNode);
        *(int *)((long)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray] + 0x40) = iVar5;
      }
      else {
        if (uVar4 == 8) {
          __assert_fail("!Abc_ObjIsLatch(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                        ,0x67,
                        "void Abc_NtkFlattenHierarchyGia2_rec(Gia_Man_t *, Abc_Ntk_t *, int *, Vec_Int_t *)"
                       );
        }
        pNtk_00 = (Abc_Ntk_t *)(pNode->field_5).pData;
        if (pNtk_00->vPis->nSize != (pNode->vFanins).nSize) {
          __assert_fail("Abc_NtkPiNum(pModel) == Abc_ObjFaninNum(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                        ,0x68,
                        "void Abc_NtkFlattenHierarchyGia2_rec(Gia_Man_t *, Abc_Ntk_t *, int *, Vec_Int_t *)"
                       );
        }
        if (pNtk_00->vPos->nSize != (pNode->vFanouts).nSize) {
          __assert_fail("Abc_NtkPoNum(pModel) == Abc_ObjFanoutNum(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                        ,0x69,
                        "void Abc_NtkFlattenHierarchyGia2_rec(Gia_Man_t *, Abc_Ntk_t *, int *, Vec_Int_t *)"
                       );
        }
        iVar5 = pNew->nBufs;
        Abc_NtkFillTemp(pNtk_00);
        if ((pNode->vFanins).nSize < 1) {
          if (vBufs != (Vec_Int_t *)0x0) goto LAB_001d23a2;
LAB_001d2443:
          Abc_NtkFlattenHierarchyGia2_rec(pNew,pNtk_00,pCounter,(Vec_Int_t *)0x0);
          iVar6 = (pNode->vFanouts).nSize;
LAB_001d2459:
          if (0 < iVar6) {
            lVar7 = 0;
            do {
              plVar2 = (long *)pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[lVar7]];
              lVar3 = *(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                               (long)*(int *)plVar2[6] * 8);
              if ((*(uint *)(lVar3 + 0x14) & 0xf) != 6) {
                __assert_fail("Abc_ObjIsNet(Abc_ObjFanout0(pTerm))",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                              ,0x79,
                              "void Abc_NtkFlattenHierarchyGia2_rec(Gia_Man_t *, Abc_Ntk_t *, int *, Vec_Int_t *)"
                             );
              }
              if (pNtk_00->vPos->nSize <= lVar7) {
LAB_001d254b:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              plVar2 = (long *)pNtk_00->vPos->pArray[lVar7];
              *(undefined4 *)(lVar3 + 0x40) =
                   *(undefined4 *)
                    (*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                              (long)*(int *)plVar2[4] * 8) + 0x40);
              lVar7 = lVar7 + 1;
            } while (lVar7 < (pNode->vFanouts).nSize);
          }
        }
        else {
          lVar7 = 0;
          do {
            plVar2 = (long *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar7]];
            lVar3 = *(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8
                             );
            if ((*(uint *)(lVar3 + 0x14) & 0xf) != 6) {
              __assert_fail("Abc_ObjIsNet(Abc_ObjFanin0(pTerm))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                            ,0x6d,
                            "void Abc_NtkFlattenHierarchyGia2_rec(Gia_Man_t *, Abc_Ntk_t *, int *, Vec_Int_t *)"
                           );
            }
            if (pNtk_00->vPis->nSize <= lVar7) goto LAB_001d254b;
            plVar2 = (long *)pNtk_00->vPis->pArray[lVar7];
            *(undefined4 *)
             (*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[6] * 8) +
             0x40) = *(undefined4 *)(lVar3 + 0x40);
            lVar7 = lVar7 + 1;
            iVar6 = (pNode->vFanins).nSize;
          } while (lVar7 < iVar6);
          if (vBufs == (Vec_Int_t *)0x0) goto LAB_001d2443;
          if (0 < iVar6) {
            lVar7 = 0;
            do {
              if (pNtk_00->vPis->nSize <= lVar7) goto LAB_001d254b;
              plVar2 = (long *)pNtk_00->vPis->pArray[lVar7];
              iVar6 = Gia_ManAppendBuf(pNew,*(int *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) +
                                                                        8) +
                                                              (long)*(int *)plVar2[6] * 8) + 0x40));
              if (pNtk_00->vPis->nSize <= lVar7) goto LAB_001d254b;
              plVar2 = (long *)pNtk_00->vPis->pArray[lVar7];
              *(int *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                (long)*(int *)plVar2[6] * 8) + 0x40) = iVar6;
              lVar7 = lVar7 + 1;
            } while (lVar7 < (pNode->vFanins).nSize);
          }
LAB_001d23a2:
          Abc_NtkFlattenHierarchyGia2_rec(pNew,pNtk_00,pCounter,vBufs);
          if (0 < (pNode->vFanouts).nSize) {
            lVar7 = 0;
            do {
              if (pNtk_00->vPos->nSize <= lVar7) goto LAB_001d254b;
              plVar2 = (long *)pNtk_00->vPos->pArray[lVar7];
              iVar6 = Gia_ManAppendBuf(pNew,*(int *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) +
                                                                        8) +
                                                              (long)*(int *)plVar2[4] * 8) + 0x40));
              if (pNtk_00->vPos->nSize <= lVar7) goto LAB_001d254b;
              plVar2 = (long *)pNtk_00->vPos->pArray[lVar7];
              *(int *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                (long)*(int *)plVar2[4] * 8) + 0x40) = iVar6;
              lVar7 = lVar7 + 1;
              iVar6 = (pNode->vFanouts).nSize;
            } while (lVar7 < iVar6);
            goto LAB_001d2459;
          }
        }
        if (vBufs != (Vec_Int_t *)0x0) {
          Vec_IntPush(vBufs,iVar5);
          Vec_IntPush(vBufs,pNtk_00->vPis->nSize);
          Vec_IntPush(vBufs,pNew->nBufs - pNtk_00->vPos->nSize);
          Vec_IntPush(vBufs,pNtk_00->vPos->nSize);
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < *(int *)((long)pvVar1 + 4));
  }
  return;
}

Assistant:

void Abc_NtkFlattenHierarchyGia2_rec( Gia_Man_t * pNew, Abc_Ntk_t * pNtk, int * pCounter, Vec_Int_t * vBufs )
{
    Vec_Ptr_t * vDfs = (Vec_Ptr_t *)pNtk->pData;
    Abc_Obj_t * pObj, * pTerm; 
    int i, k; (*pCounter)++;
    //printf( "[%d:%d] ", Abc_NtkPiNum(pNtk), Abc_NtkPoNum(pNtk) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vDfs, pObj, i )
    {
        if ( Abc_ObjIsNode(pObj) )
            Abc_ObjFanout0(pObj)->iTemp = Abc_NodeStrashToGia( pNew, pObj );
        else
        {
            int iBufStart = Gia_ManBufNum(pNew);
            Abc_Ntk_t * pModel = (Abc_Ntk_t *)pObj->pData;
            assert( !Abc_ObjIsLatch(pObj) );
            assert( Abc_NtkPiNum(pModel) == Abc_ObjFaninNum(pObj) );
            assert( Abc_NtkPoNum(pModel) == Abc_ObjFanoutNum(pObj) );
            Abc_NtkFillTemp( pModel );
            Abc_ObjForEachFanin( pObj, pTerm, k )
            {
                assert( Abc_ObjIsNet(Abc_ObjFanin0(pTerm)) );
                Abc_ObjFanout0(Abc_NtkPi(pModel, k))->iTemp = Abc_ObjFanin0(pTerm)->iTemp;
            }
            if ( vBufs )
                Abc_ObjForEachFanin( pObj, pTerm, k )
                    Abc_ObjFanout0(Abc_NtkPi(pModel, k))->iTemp = Gia_ManAppendBuf( pNew, Abc_ObjFanout0(Abc_NtkPi(pModel, k))->iTemp );
            Abc_NtkFlattenHierarchyGia2_rec( pNew, pModel, pCounter, vBufs );
            if ( vBufs )
                Abc_ObjForEachFanout( pObj, pTerm, k )
                    Abc_ObjFanin0(Abc_NtkPo(pModel, k))->iTemp = Gia_ManAppendBuf( pNew, Abc_ObjFanin0(Abc_NtkPo(pModel, k))->iTemp );
            Abc_ObjForEachFanout( pObj, pTerm, k )
            {
                assert( Abc_ObjIsNet(Abc_ObjFanout0(pTerm)) );
                Abc_ObjFanout0(pTerm)->iTemp = Abc_ObjFanin0(Abc_NtkPo(pModel, k))->iTemp;
            }
            // save buffers
            if ( vBufs == NULL )
                continue;
            Vec_IntPush( vBufs, iBufStart );
            Vec_IntPush( vBufs, Abc_NtkPiNum(pModel) );
            Vec_IntPush( vBufs, Gia_ManBufNum(pNew) - Abc_NtkPoNum(pModel) );
            Vec_IntPush( vBufs, Abc_NtkPoNum(pModel) );
        }
    }
}